

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O1

int __thiscall QStackedLayout::heightForWidth(QStackedLayout *this,int width)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  int extraout_var;
  int iVar4;
  int iVar5;
  
  iVar1 = (**(code **)(*(long *)&this->super_QLayout + 200))();
  if (iVar1 < 1) {
    iVar4 = 0;
  }
  else {
    iVar5 = 0;
    iVar4 = 0;
    do {
      plVar3 = (long *)(**(code **)(*(long *)&this->super_QLayout + 0xa8))(this,iVar5);
      if (((plVar3 != (long *)0x0) &&
          (plVar3 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3), plVar3 != (long *)0x0)) &&
         (iVar2 = (**(code **)(*plVar3 + 0x80))(plVar3,width), iVar4 <= iVar2)) {
        iVar4 = iVar2;
      }
      iVar5 = iVar5 + 1;
    } while (iVar1 != iVar5);
  }
  (**(code **)(*(long *)&this->super_QLayout + 0x90))(this);
  iVar1 = extraout_var;
  if (extraout_var < iVar4) {
    iVar1 = iVar4;
  }
  return iVar1;
}

Assistant:

int QStackedLayout::heightForWidth(int width) const
{
    const int n = count();

    int hfw = 0;
    for (int i = 0; i < n; ++i) {
        if (QLayoutItem *item = itemAt(i)) {
            if (QWidget *w = item->widget())
                /*
                Note: Does not query the layout item, but bypasses it and asks the widget
                directly. This is consistent with how QStackedLayout::sizeHint() is
                implemented. This also avoids an issue where QWidgetItem::heightForWidth()
                returns -1 if the widget is hidden.
                */
                hfw = qMax(hfw, w->heightForWidth(width));
        }
    }
    hfw = qMax(hfw, minimumSize().height());
    return hfw;
}